

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall asmjit::v1_14::ZoneAllocator::reset(ZoneAllocator *this,Zone *zone)

{
  void *pvVar1;
  void *__ptr;
  
  __ptr = *(void **)(this + 0x58);
  while (__ptr != (void *)0x0) {
    pvVar1 = *(void **)((long)__ptr + 8);
    free(__ptr);
    __ptr = pvVar1;
  }
  *(Zone **)this = zone;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  return;
}

Assistant:

void ZoneAllocator::reset(Zone* zone) noexcept {
  // Free dynamic blocks.
  DynamicBlock* block = _dynamicBlocks;
  while (block) {
    DynamicBlock* next = block->next;
    ::free(block);
    block = next;
  }

  _zone = zone;
  memset(_slots, 0, sizeof(_slots));
  _dynamicBlocks = nullptr;
}